

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

void M3x3_RotateY(double (*input) [3],double degrees,double (*result) [3])

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double transformationmatrix [3] [3];
  double local_68 [6];
  double local_38;
  double local_28;
  
  lVar1 = 9;
  pdVar2 = IdentityMatrix[0];
  pdVar3 = local_68;
  for (; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = *pdVar2;
    pdVar2 = pdVar2 + 1;
    pdVar3 = pdVar3 + 1;
  }
  dVar4 = cos(degrees * 0.017453292519943295);
  local_68[2] = sin(degrees * 0.017453292519943295);
  local_38 = -local_68[2];
  local_68[0] = dVar4;
  local_28 = dVar4;
  M3x3_MulMatrix((double (*) [3])local_68,input,result);
  return;
}

Assistant:

void M3x3_RotateY(double input[3][3], double degrees, double result[3][3])
{
    double transformationmatrix[3][3];
    double sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

    radians = degrees * (M_PI/180.0);
    cosvalue = cos(radians);
    sinvalue = sin(radians);

    transformationmatrix[0][0] =  cosvalue;
    transformationmatrix[0][2] =  sinvalue;
    transformationmatrix[2][0] = -sinvalue;
    transformationmatrix[2][2] =  cosvalue;

    M3x3_MulMatrix(transformationmatrix, input, result);
}